

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool parse_string(cJSON *item,parse_buffer *input_buffer)

{
  uchar *puVar1;
  long in_FS_OFFSET;
  bool bVar2;
  byte local_59;
  long lStack_58;
  uchar sequence_length;
  size_t skipped_bytes;
  size_t allocation_length;
  uchar *output;
  uchar *input_end;
  uchar *input_pointer;
  parse_buffer *input_buffer_local;
  cJSON *item_local;
  uchar *local_18;
  uchar *output_pointer;
  
  output_pointer = *(uchar **)(in_FS_OFFSET + 0x28);
  input_end = input_buffer->content + input_buffer->offset + 1;
  local_18 = (uchar *)0x0;
  allocation_length = 0;
  if (input_buffer->content[input_buffer->offset] == '\"') {
    lStack_58 = 0;
    output = input_buffer->content + input_buffer->offset;
    while( true ) {
      puVar1 = output;
      output = puVar1 + 1;
      bVar2 = false;
      if ((ulong)((long)output - (long)input_buffer->content) < input_buffer->length) {
        bVar2 = *output != '\"';
      }
      if (!bVar2) break;
      if (*output == '\\') {
        if ((uchar *)input_buffer->length <= puVar1 + (2 - (long)input_buffer->content))
        goto LAB_00107436;
        lStack_58 = lStack_58 + 1;
        output = puVar1 + 2;
      }
    }
    if ((((ulong)((long)output - (long)input_buffer->content) < input_buffer->length) &&
        (*output == '\"')) &&
       (allocation_length =
             (size_t)(*(input_buffer->hooks).allocate)
                               ((size_t)(output + (-lStack_58 -
                                                  (long)(input_buffer->content +
                                                        input_buffer->offset)) + 1)),
       puVar1 = (uchar *)allocation_length, (uchar *)allocation_length != (uchar *)0x0)) {
      while (local_18 = puVar1, input_end < output) {
        if (*input_end == '\\') {
          local_59 = 2;
          if ((long)output - (long)input_end < 1) goto LAB_00107436;
          switch(input_end[1]) {
          case '\"':
          case '/':
          case '\\':
            *local_18 = input_end[1];
            local_18 = local_18 + 1;
            break;
          default:
            goto LAB_00107436;
          case 'b':
            *local_18 = '\b';
            local_18 = local_18 + 1;
            break;
          case 'f':
            *local_18 = '\f';
            local_18 = local_18 + 1;
            break;
          case 'n':
            *local_18 = '\n';
            local_18 = local_18 + 1;
            break;
          case 'r':
            *local_18 = '\r';
            local_18 = local_18 + 1;
            break;
          case 't':
            *local_18 = '\t';
            local_18 = local_18 + 1;
            break;
          case 'u':
            local_59 = utf16_literal_to_utf8(input_end,output,&local_18);
            if (local_59 == 0) goto LAB_00107436;
          }
          input_end = input_end + (int)(uint)local_59;
          puVar1 = local_18;
        }
        else {
          *local_18 = *input_end;
          input_end = input_end + 1;
          puVar1 = local_18 + 1;
        }
      }
      *local_18 = '\0';
      item->type = 0x10;
      item->valuestring = (char *)allocation_length;
      input_buffer->offset = (long)output - (long)input_buffer->content;
      input_buffer->offset = input_buffer->offset + 1;
      item_local._4_4_ = 1;
      goto LAB_0010746f;
    }
  }
LAB_00107436:
  if (allocation_length != 0) {
    (*(input_buffer->hooks).deallocate)((void *)allocation_length);
  }
  if (input_end != (uchar *)0x0) {
    input_buffer->offset = (long)input_end - (long)input_buffer->content;
  }
  item_local._4_4_ = 0;
LAB_0010746f:
  if (*(uchar **)(in_FS_OFFSET + 0x28) == output_pointer) {
    return item_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static cJSON_bool parse_string(cJSON * const item, parse_buffer * const input_buffer)
{
    const unsigned char *input_pointer = buffer_at_offset(input_buffer) + 1;
    const unsigned char *input_end = buffer_at_offset(input_buffer) + 1;
    unsigned char *output_pointer = NULL;
    unsigned char *output = NULL;

    /* not a string */
    if (buffer_at_offset(input_buffer)[0] != '\"')
    {
        goto fail;
    }

    {
        /* calculate approximate size of the output (overestimate) */
        size_t allocation_length = 0;
        size_t skipped_bytes = 0;
        while (((size_t)(input_end - input_buffer->content) < input_buffer->length) && (*input_end != '\"'))
        {
            /* is escape sequence */
            if (input_end[0] == '\\')
            {
                if ((size_t)(input_end + 1 - input_buffer->content) >= input_buffer->length)
                {
                    /* prevent buffer overflow when last input character is a backslash */
                    goto fail;
                }
                skipped_bytes++;
                input_end++;
            }
            input_end++;
        }
        if (((size_t)(input_end - input_buffer->content) >= input_buffer->length) || (*input_end != '\"'))
        {
            goto fail; /* string ended unexpectedly */
        }

        /* This is at most how much we need for the output */
        allocation_length = (size_t) (input_end - buffer_at_offset(input_buffer)) - skipped_bytes;
        output = (unsigned char*)input_buffer->hooks.allocate(allocation_length + sizeof(""));
        if (output == NULL)
        {
            goto fail; /* allocation failure */
        }
    }

    output_pointer = output;
    /* loop through the string literal */
    while (input_pointer < input_end)
    {
        if (*input_pointer != '\\')
        {
            *output_pointer++ = *input_pointer++;
        }
        /* escape sequence */
        else
        {
            unsigned char sequence_length = 2;
            if ((input_end - input_pointer) < 1)
            {
                goto fail;
            }

            switch (input_pointer[1])
            {
                case 'b':
                    *output_pointer++ = '\b';
                    break;
                case 'f':
                    *output_pointer++ = '\f';
                    break;
                case 'n':
                    *output_pointer++ = '\n';
                    break;
                case 'r':
                    *output_pointer++ = '\r';
                    break;
                case 't':
                    *output_pointer++ = '\t';
                    break;
                case '\"':
                case '\\':
                case '/':
                    *output_pointer++ = input_pointer[1];
                    break;

                /* UTF-16 literal */
                case 'u':
                    sequence_length = utf16_literal_to_utf8(input_pointer, input_end, &output_pointer);
                    if (sequence_length == 0)
                    {
                        /* failed to convert UTF16-literal to UTF-8 */
                        goto fail;
                    }
                    break;

                default:
                    goto fail;
            }
            input_pointer += sequence_length;
        }
    }

    /* zero terminate the output */
    *output_pointer = '\0';

    item->type = cJSON_String;
    item->valuestring = (char*)output;

    input_buffer->offset = (size_t) (input_end - input_buffer->content);
    input_buffer->offset++;

    return true;

fail:
    if (output != NULL)
    {
        input_buffer->hooks.deallocate(output);
    }

    if (input_pointer != NULL)
    {
        input_buffer->offset = (size_t)(input_pointer - input_buffer->content);
    }

    return false;
}